

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void dump_cur_dill_insn(dill_stream_conflict s)

{
  uint *puVar1;
  long *in_RDI;
  void *p;
  disassemble_info info;
  undefined1 local_10 [8];
  long *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x188))(in_RDI,local_10);
  puVar1 = *(uint **)(local_8[1] + 8);
  printf("%p  - %x - ",puVar1,(ulong)*puVar1);
  (**(code **)(*local_8 + 400))(local_8,local_10,puVar1);
  printf("\n");
  return;
}

Assistant:

extern void
dump_cur_dill_insn(dill_stream s)
{
    struct disassemble_info info;
    s->j->init_disassembly(s, &info);

    void* p = s->p->cur_ip;
    printf("%p  - %x - ", p, (unsigned)*(int*)p);
    (void)s->j->print_insn(s, &info, (void*)p);
    printf("\n");
}